

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picPageAnalyzer.cpp
# Opt level: O3

string * __thiscall
picPageAnalyzer::getOriginalPicSourceURL_abi_cxx11_
          (string *__return_storage_ptr__,picPageAnalyzer *this)

{
  int iVar1;
  uint uVar2;
  char cVar3;
  ulong uVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  string result_middle;
  string local_98;
  string local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  string local_50;
  
  paVar5 = &local_98.field_2;
  local_98._M_dataplus._M_p = (pointer)paVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Download original","");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"href=\"","");
  pageAnalyzer::getInfoFromContent
            (&local_78,&this->super_pageAnalyzer,&local_98,-1,0x12,&local_50,'\"');
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar5) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  local_98._M_dataplus._M_p = (pointer)paVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"&amp;","");
  uVar2 = std::__cxx11::string::find((char *)&local_78,(ulong)local_98._M_dataplus._M_p,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar5) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  while (uVar2 != 0xffffffff) {
    __return_storage_ptr__->_M_string_length = 0;
    *(__return_storage_ptr__->_M_dataplus)._M_p = '\0';
    cVar3 = (char)__return_storage_ptr__;
    if ((int)uVar2 < 1) {
      uVar2 = 0;
    }
    else {
      uVar4 = 0;
      do {
        std::__cxx11::string::push_back(cVar3);
        uVar4 = uVar4 + 1;
      } while ((uVar2 & 0x7fffffff) != uVar4);
    }
    paVar5 = &local_98.field_2;
    std::__cxx11::string::push_back(cVar3);
    local_98._M_dataplus._M_p = (pointer)paVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"&amp;","");
    iVar1 = (int)local_98._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar5) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    for (uVar4 = (ulong)(int)(uVar2 + iVar1); uVar4 < local_78._M_string_length; uVar4 = uVar4 + 1)
    {
      std::__cxx11::string::push_back(cVar3);
    }
    std::__cxx11::string::_M_assign((string *)&local_78);
    local_98._M_dataplus._M_p = (pointer)paVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"&amp;","");
    uVar2 = std::__cxx11::string::find((char *)&local_78,(ulong)local_98._M_dataplus._M_p,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar5) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string picPageAnalyzer::getOriginalPicSourceURL()
{
    std::string result_middle = this->getInfoFromContent(std::string("Download original"), -1, GETMODE_PART, std::string("href=\""), '\"');
    std::string result = std::string("");

    //Part to handle special character "&amp;". It will be replaced by a more uniform function in the future
    int errpos = result_middle.find(std::string("&amp;"));
    while(errpos != std::string::npos)
    {
        result.clear();
        int rpos = 0;
        for(rpos = 0; rpos < errpos; rpos++)
            result += result_middle[rpos];

        result += result_middle[errpos];

        rpos += std::string("&amp;").length();

        for(; rpos < result_middle.length(); rpos++)
            result += result_middle[rpos];

        result_middle = result;

        errpos = result_middle.find(std::string("&amp;"));
    }
    return result;
}